

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

int cmp2it(void *a,void *b)

{
  int *bry;
  int *ary;
  void *b_local;
  void *a_local;
  
  if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else if (*b < *a) {
    a_local._4_4_ = 1;
  }
  else if (*(int *)((long)a + 4) < *(int *)((long)b + 4)) {
    a_local._4_4_ = -1;
  }
  else if (*(int *)((long)b + 4) < *(int *)((long)a + 4)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int cmp2it(const void *a, const void *b) {
    auto *ary = (int *) a;
    auto *bry = (int *) b;
    if (ary[0] < bry[0]) return -1;
    else if (ary[0] > bry[0]) return 1;
    else {
        if (ary[1] < bry[1]) return -1;
        else if (ary[1] > bry[1]) return 1;
        else return 0;
    }
}